

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateNoExcept
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errorCodes,vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,CommandFlavourFlags flavourFlags,bool vectorSizeCheck,bool raii)

{
  pointer puVar1;
  bool bVar2;
  char *pcVar3;
  pointer puVar4;
  char *__s;
  allocator<char> local_39;
  unsigned_long local_38;
  
  __s = "";
  if ((errorCodes->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (errorCodes->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    if ((flavourFlags.m_mask & 4) == 0) {
      puVar4 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar1 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar4 != puVar1) {
        do {
          if (puVar4 == puVar1) goto LAB_00134f64;
          local_38 = *puVar4;
          bVar2 = std::
                  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                  ::contains(vectorParams,&local_38);
          puVar4 = puVar4 + 1;
        } while (!bVar2);
        goto LAB_00134f8b;
      }
    }
LAB_00134f64:
    pcVar3 = " VULKAN_HPP_NOEXCEPT_WHEN_NO_EXCEPTIONS";
    if (raii) {
      pcVar3 = "";
    }
    __s = " VULKAN_HPP_NOEXCEPT";
    if (vectorSizeCheck) {
      __s = pcVar3;
    }
  }
LAB_00134f8b:
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_39)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateNoExcept( std::vector<std::string> const &          errorCodes,
                                                  std::vector<size_t> const &               returnParams,
                                                  std::map<size_t, VectorParamData> const & vectorParams,
                                                  CommandFlavourFlags                       flavourFlags,
                                                  bool                                      vectorSizeCheck,
                                                  bool                                      raii ) const
{
  // noexcept is only possible with no error codes, and the return param (if any) is not a vector param (unless it's the singular version)
  return ( errorCodes.empty() && ( ( flavourFlags & CommandFlavourFlagBits::singular ) || returnParams.empty() ||
                                   std::ranges::none_of( returnParams, [&vectorParams]( size_t rp ) { return vectorParams.contains( rp ); } ) ) )
         ? ( vectorSizeCheck ? ( raii ? "" : " VULKAN_HPP_NOEXCEPT_WHEN_NO_EXCEPTIONS" ) : " VULKAN_HPP_NOEXCEPT" )
         : "";
}